

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::setMinimumDateTime(DateTimePicker *this,QDateTime *dt)

{
  DateTimePickerPrivate *this_00;
  char cVar1;
  long lVar2;
  QDateTime *max;
  QDateTime m;
  QDateTime local_30 [8];
  QDate local_28;
  
  cVar1 = QDateTime::isValid();
  if (cVar1 != '\0') {
    lVar2 = QDateTime::date();
    QDate::QDate(&local_28,100,1,1);
    if (local_28.jd <= lVar2) {
      QDateTime::toTimeSpec((TimeSpec)local_30);
      this_00 = (this->d).d;
      cVar1 = QDateTime::precedes(local_30);
      max = &((this->d).d)->maximum;
      if (cVar1 == '\0') {
        max = local_30;
      }
      DateTimePickerPrivate::setRange(this_00,local_30,max);
      QDateTime::~QDateTime(local_30);
    }
  }
  return;
}

Assistant:

void
DateTimePicker::setMinimumDateTime( const QDateTime & dt )
{
	if( dt.isValid() && dt.date() >= DATETIMEPICKER_DATE_MIN )
	{
		const QDateTime m = dt.toTimeSpec( d->spec );
		d->setRange( m, ( d->maximum > m ? d->maximum : m ) );
	}
}